

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O2

string * load_string_abi_cxx11_
                   (string *__return_storage_ptr__,bool use_colors,bool use_powerline_left,
                   bool use_powerline_right,short num_averages,bool segments_to_right,
                   short right_color)

{
  double dVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  ostream *poVar7;
  byte bVar8;
  POWERLINE_DIRECTION PVar9;
  undefined7 in_register_00000009;
  POWERLINE_DIRECTION direction;
  undefined7 in_register_00000011;
  int __nelem;
  undefined7 in_register_00000031;
  undefined6 in_register_00000082;
  undefined3 in_register_00000089;
  ulong uVar10;
  double *pdVar11;
  char (*pacVar12) [32];
  double *__loadavg;
  bool bVar13;
  float fVar14;
  ulong uStack_1e0;
  double local_1d8;
  ostringstream ss;
  uint auStack_1c0 [88];
  undefined1 *local_60;
  undefined4 local_54;
  string *local_50;
  ulong local_48;
  undefined4 local_40;
  POWERLINE_DIRECTION local_3c;
  undefined4 local_38;
  POWERLINE_DIRECTION local_34;
  
  pdVar11 = &local_1d8;
  local_38 = (undefined4)CONCAT71(in_register_00000009,use_powerline_right);
  local_3c = (POWERLINE_DIRECTION)CONCAT71(in_register_00000011,use_powerline_left);
  local_40 = (undefined4)CONCAT71(in_register_00000031,use_colors);
  uStack_1e0 = 0x104221;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d8);
  *(uint *)((long)auStack_1c0 + *(long *)((long)local_1d8 + -0x18)) =
       *(uint *)((long)auStack_1c0 + *(long *)((long)local_1d8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&ss + *(long *)((long)local_1d8 + -0x18)) = 2;
  lVar3 = -(ulong)((uint)(ushort)num_averages * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)&local_1d8 + lVar3);
  if ((ushort)(num_averages - 4U) < 0xfffd) {
    *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104280;
    std::operator<<((ostream *)&local_1d8,'\0');
    pdVar11 = &local_1d8;
  }
  else {
    *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104290;
    __nelem = (int)CONCAT62(in_register_00000082,num_averages);
    iVar4 = getloadavg(__loadavg,__nelem);
    if (iVar4 < 0) {
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104410;
      std::operator<<((ostream *)&local_1d8," 0.00 0.00 0.00");
    }
    else {
      local_54 = CONCAT31(in_register_00000089,segments_to_right);
      local_50 = (string *)*__loadavg;
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1042ab;
      uVar5 = get_cpu_count();
      uVar6 = (ulong)(((double)local_50 / (double)uVar5) * 0.5 * 100.0);
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 100;
      PVar9 = local_3c;
      uVar10 = *(ulong *)((long)&uStack_1e0 + lVar3);
      if ((uint)uVar6 < 100) {
        uVar10 = uVar6;
      }
      local_48 = uVar10 & 0xffffffff;
      if ((char)local_40 != '\0') {
        bVar13 = (char)local_38 == '\0';
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 2;
        direction = (POWERLINE_DIRECTION)*(undefined8 *)((long)&uStack_1e0 + lVar3);
        if (bVar13) {
          direction = PVar9 & 0xff;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104313;
        powerline((ostringstream *)&local_1d8,load_lut[uVar10 & 0xffffffff],direction,false);
      }
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x20;
      uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104322;
      std::operator<<((ostream *)&local_1d8,(char)uVar2);
      local_60 = (undefined1 *)&local_1d8;
      local_50 = __return_storage_ptr__;
      *(undefined8 *)((long)&uStack_1e0 + lVar3) = 2;
      local_34 = (POWERLINE_DIRECTION)*(undefined8 *)((long)&uStack_1e0 + lVar3);
      for (uVar10 = 0; __return_storage_ptr__ = local_50, pdVar11 = (double *)local_60,
          (CONCAT62(in_register_00000082,num_averages) & 0xffffffff) != uVar10; uVar10 = uVar10 + 1)
      {
        dVar1 = __loadavg[uVar10];
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104365;
        fVar14 = floorf((float)dVar1 * 100.0 + 0.5);
        if (__nelem - 1 == uVar10) {
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x10437a;
          std::ostream::operator<<(&local_1d8,fVar14 / 100.0);
        }
        else {
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104384;
          poVar7 = (ostream *)std::ostream::operator<<(&local_1d8,fVar14 / 100.0);
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104393;
          std::operator<<(poVar7," ");
        }
      }
      if ((char)local_40 != '\0') {
        bVar8 = (byte)local_54;
        if (((byte)local_3c & bVar8) == 1) {
          pacVar12 = load_lut + local_48;
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
          uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
          PVar9 = (POWERLINE_DIRECTION)uVar2;
          local_34 = PVar9;
          *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1043e1;
          powerline((ostringstream *)&local_1d8,*pacVar12,PVar9,SUB81(uVar2,0));
        }
        else {
          if ((byte)local_3c == 1 && bVar8 == 0) {
            pacVar12 = load_lut + local_48;
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
            uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x10447d;
            powerline((ostringstream *)&local_1d8,*pacVar12,(POWERLINE_DIRECTION)uVar2,
                      SUB81(uVar2,0));
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
            uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x104495;
            powerline((ostringstream *)&local_1d8,"#[fg=default,bg=default]",
                      (POWERLINE_DIRECTION)uVar2,false);
            goto LAB_00104410;
          }
          if ((char)local_38 == '\0') {
            *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1044ad;
            std::operator<<((ostream *)&local_1d8,"#[fg=default,bg=default]");
            goto LAB_00104410;
          }
          if (bVar8 == 0) goto LAB_00104410;
          pacVar12 = load_lut + local_48;
        }
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 1;
        PVar9 = local_34;
        uVar2 = *(undefined8 *)((long)&uStack_1e0 + lVar3);
        *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x1043fb;
        powerline_char((ostringstream *)&local_1d8,*pacVar12,right_color,PVar9,SUB81(uVar2,0));
      }
    }
  }
LAB_00104410:
  *(undefined8 *)((long)&uStack_1e0 + lVar3) = 0x10441f;
  std::__cxx11::stringbuf::str();
  *(undefined8 *)((long)pdVar11 + -8) = 0x10442e;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right, short num_averages,
  bool segments_to_right, short right_color )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left && segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_LEFT, true );
      }
      else if( use_powerline_left && !segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
      else if ( segments_to_right && use_powerline_right )
      {
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_RIGHT, true );
      }
    }
  }

  return ss.str();
}